

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::nameEnv(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *this_01;
  uint uVar1;
  int iVar2;
  RefAST RVar3;
  NoViableAltException *pNVar4;
  RefCount<AST> *this_02;
  RefAST tmp67_AST;
  RefAST tmp66_AST;
  RefAST nameEnv_AST;
  ASTPair currentAST;
  RefAST tmp64_AST;
  undefined1 local_d0 [16];
  RefCount<AST> local_c0;
  ASTPair local_b8;
  RefCount<AST> local_a0;
  RefCount<Token> local_98;
  ASTFactory local_90;
  RefCount<Token> local_80;
  RefCount<Token> local_78;
  RefToken local_70;
  RefToken local_68;
  RefToken local_60;
  RefAST local_58;
  RefAST local_50;
  RefAST local_48;
  RefAST local_40;
  RefAST local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_c0.ref = nullAST.ref;
  local_b8.root.ref = (Ref *)0x0;
  local_b8.child.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_c0.ref = (Ref *)0x0;
  }
  else {
    uVar1 = (nullAST.ref)->count;
    (nullAST.ref)->count = uVar1 + 1;
    (local_c0.ref)->count = uVar1 + 2;
  }
  local_a0.ref = local_c0.ref;
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
  this_01 = &(this->super_LLkParser).super_Parser.astFactory;
  ASTFactory::create((ASTFactory *)(local_d0 + 8),(RefToken *)this_01);
  RefCount<AST>::operator=(&local_a0,(RefCount<AST> *)(local_d0 + 8));
  RefCount<AST>::~RefCount((RefCount<AST> *)(local_d0 + 8));
  RefCount<Token>::~RefCount(&local_78);
  if (local_a0.ref == (Ref *)0x0) {
    local_50.ref = (Ref *)0x0;
  }
  else {
    (local_a0.ref)->count = (local_a0.ref)->count + 1;
    local_50.ref = local_a0.ref;
  }
  ASTFactory::makeASTRoot(this_01,&local_b8,&local_50);
  RefCount<AST>::~RefCount(&local_50);
  Parser::match((Parser *)this,9);
  uVar1 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (uVar1 < 0x12) {
    if ((0x26700U >> (uVar1 & 0x1f) & 1) == 0) {
      if (uVar1 != 0xb) goto LAB_0018f034;
      directives(this);
      local_58.ref = this_00->ref;
      if (local_58.ref == (Ref *)0x0) {
        local_58.ref = (Ref *)0x0;
      }
      else {
        (local_58.ref)->count = (local_58.ref)->count + 1;
      }
      ASTFactory::addASTChild(this_01,&local_b8,&local_58);
      RefCount<AST>::~RefCount(&local_58);
    }
    uVar1 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    RVar3 = nullAST;
    if (uVar1 < 0x12) {
      if ((0x26600U >> (uVar1 & 0x1f) & 1) != 0) goto LAB_0018f149;
      if (uVar1 == 8) {
        if (nullAST.ref == (Ref *)0x0) {
          RVar3.ref = (Ref *)0x0;
        }
        else {
          (nullAST.ref)->count = (nullAST.ref)->count + 1;
        }
        local_d0._8_8_ = RVar3.ref;
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
        ASTFactory::create((ASTFactory *)local_d0,(RefToken *)this_01);
        RefCount<AST>::operator=((RefCount<AST> *)(local_d0 + 8),(RefCount<AST> *)local_d0);
        RefCount<AST>::~RefCount((RefCount<AST> *)local_d0);
        RefCount<Token>::~RefCount(&local_80);
        Parser::match((Parser *)this,8);
        this_02 = (RefCount<AST> *)(local_d0 + 8);
        do {
          RefCount<AST>::~RefCount(this_02);
LAB_0018f149:
          iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
          RVar3 = nullAST;
          switch(iVar2) {
          case 9:
            nameEnv(this);
            local_40.ref = this_00->ref;
            if (local_40.ref == (Ref *)0x0) {
              local_40.ref = (Ref *)0x0;
            }
            else {
              (local_40.ref)->count = (local_40.ref)->count + 1;
            }
            this_02 = &local_40;
            ASTFactory::addASTChild(this_01,&local_b8,this_02);
            break;
          default:
            goto switchD_0018f171_caseD_a;
          case 0xd:
          case 0x11:
            nameSpecList(this);
            local_38.ref = this_00->ref;
            if (local_38.ref == (Ref *)0x0) {
              local_38.ref = (Ref *)0x0;
            }
            else {
              (local_38.ref)->count = (local_38.ref)->count + 1;
            }
            this_02 = &local_38;
            ASTFactory::addASTChild(this_01,&local_b8,this_02);
            break;
          case 0xe:
            tableDecl(this);
            local_48.ref = this_00->ref;
            if (local_48.ref == (Ref *)0x0) {
              local_48.ref = (Ref *)0x0;
            }
            else {
              (local_48.ref)->count = (local_48.ref)->count + 1;
            }
            this_02 = &local_48;
            ASTFactory::addASTChild(this_01,&local_b8,this_02);
          }
        } while( true );
      }
    }
    pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_68,this,1);
    NoViableAltException::NoViableAltException(pNVar4,&local_68);
    __cxa_throw(pNVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  }
LAB_0018f034:
  pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_60,this,1);
  NoViableAltException::NoViableAltException(pNVar4,&local_60);
  __cxa_throw(pNVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
switchD_0018f171_caseD_a:
  if (nullAST.ref == (Ref *)0x0) {
    RVar3.ref = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  local_d0._8_8_ = RVar3.ref;
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_90.nodeFactory,this,1);
  ASTFactory::create((ASTFactory *)local_d0,(RefToken *)this_01);
  RefCount<AST>::operator=((RefCount<AST> *)(local_d0 + 8),(RefCount<AST> *)local_d0);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_d0);
  RefCount<Token>::~RefCount((RefCount<Token> *)&local_90.nodeFactory);
  Parser::match((Parser *)this,10);
  uVar1 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  RVar3 = nullAST;
  if (uVar1 < 0x12) {
    if ((0x2e600U >> (uVar1 & 0x1f) & 1) == 0) {
      if (uVar1 != 8) goto LAB_0018f37f;
      if (nullAST.ref == (Ref *)0x0) {
        RVar3.ref = (Ref *)0x0;
      }
      else {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      local_d0._0_8_ = RVar3.ref;
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_98,this,1);
      ASTFactory::create(&local_90,(RefToken *)this_01);
      RefCount<AST>::operator=((RefCount<AST> *)local_d0,(RefCount<AST> *)&local_90);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_90);
      RefCount<Token>::~RefCount(&local_98);
      Parser::match((Parser *)this,8);
      RefCount<AST>::~RefCount((RefCount<AST> *)local_d0);
    }
    RefCount<AST>::operator=(&local_c0,&local_b8.root);
    RefCount<AST>::~RefCount((RefCount<AST> *)(local_d0 + 8));
    RefCount<AST>::~RefCount(&local_a0);
    RefCount<AST>::operator=(this_00,&local_c0);
    RefCount<AST>::~RefCount(&local_c0);
    RefCount<AST>::~RefCount(&local_b8.child);
    RefCount<AST>::~RefCount(&local_b8.root);
    return;
  }
LAB_0018f37f:
  pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_70,this,1);
  NoViableAltException::NoViableAltException(pNVar4,&local_70);
  __cxa_throw(pNVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
}

Assistant:

void GrpParser::nameEnv() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST nameEnv_AST = nullAST;
	
	try {      // for error handling
		RefAST tmp64_AST = nullAST;
		tmp64_AST = astFactory.create(LT(1));
		astFactory.makeASTRoot(currentAST, tmp64_AST);
		match(LITERAL_environment);
		{
		switch ( LA(1)) {
		case OP_LBRACE:
		{
			directives();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case OP_SEMI:
		case LITERAL_environment:
		case LITERAL_endenvironment:
		case IDENT:
		case LITERAL_table:
		case LIT_INT:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		switch ( LA(1)) {
		case OP_SEMI:
		{
			RefAST tmp65_AST = nullAST;
			tmp65_AST = astFactory.create(LT(1));
			match(OP_SEMI);
			break;
		}
		case LITERAL_environment:
		case LITERAL_endenvironment:
		case IDENT:
		case LITERAL_table:
		case LIT_INT:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		do {
			switch ( LA(1)) {
			case IDENT:
			case LIT_INT:
			{
				nameSpecList();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			case LITERAL_environment:
			{
				nameEnv();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			case LITERAL_table:
			{
				tableDecl();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			default:
			{
				goto _loop35;
			}
			}
		} while (true);
		_loop35:;
		}
		RefAST tmp66_AST = nullAST;
		tmp66_AST = astFactory.create(LT(1));
		match(LITERAL_endenvironment);
		{
		switch ( LA(1)) {
		case OP_SEMI:
		{
			RefAST tmp67_AST = nullAST;
			tmp67_AST = astFactory.create(LT(1));
			match(OP_SEMI);
			break;
		}
		case LITERAL_environment:
		case LITERAL_endenvironment:
		case IDENT:
		case LITERAL_table:
		case LITERAL_endtable:
		case LIT_INT:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		nameEnv_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_14);
	}
	returnAST = nameEnv_AST;
}